

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_io.c
# Opt level: O1

uintmax_t duckdb_je_malloc_strtoumax(char *nptr,char **endptr,int base)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int *piVar4;
  uintmax_t uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  bool bVar12;
  
  pbVar9 = (byte *)nptr;
  pbVar11 = (byte *)nptr;
  if (0x24 < (uint)base || base == 1) {
LAB_01c87060:
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    uVar5 = 0xffffffffffffffff;
    goto LAB_01c871b8;
  }
  for (; (bVar3 = *pbVar11, bVar3 - 9 < 5 || (bVar3 == 0x20)); pbVar11 = pbVar11 + 1) {
  }
  if (bVar3 == 0x2b) {
    bVar2 = false;
LAB_01c870a1:
    pbVar11 = pbVar11 + 1;
  }
  else {
    if (bVar3 == 0x2d) {
      bVar2 = true;
      goto LAB_01c870a1;
    }
    bVar2 = false;
  }
  pbVar9 = pbVar11;
  if (*pbVar11 == 0x30) {
    pbVar9 = pbVar11 + 1;
    bVar3 = pbVar11[1];
    if (bVar3 - 0x30 < 8) {
      if (base == 0) {
        base = 8;
      }
      bVar12 = base == 8;
    }
    else {
      if ((bVar3 != 0x58) && (bVar3 != 0x78)) {
        uVar5 = 0;
        goto LAB_01c871b8;
      }
      pbVar9 = pbVar11;
      if ((0x36 < pbVar11[2] - 0x30) ||
         ((0x7e0000007e03ffU >> ((ulong)(pbVar11[2] - 0x30) & 0x3f) & 1) == 0)) goto LAB_01c8711c;
      if (base == 0) {
        base = 0x10;
      }
      pbVar9 = pbVar11 + 2;
      bVar12 = base == 0x10;
    }
    if (!bVar12) {
      pbVar9 = pbVar11;
    }
  }
LAB_01c8711c:
  uVar8 = 10;
  if (base != 0) {
    uVar8 = (ulong)(uint)base;
  }
  uVar6 = 0;
  while( true ) {
    bVar1 = *pbVar9;
    bVar3 = bVar1 - 0x30;
    uVar7 = (uint)uVar8;
    if ((((9 < bVar3) || (uVar7 <= bVar3)) &&
        ((0x19 < (byte)(bVar1 + 0xbf) || (bVar3 = bVar1 - 0x37, uVar7 <= bVar3)))) &&
       ((0x19 < (byte)(bVar1 + 0x9f) || (bVar3 = bVar1 + 0xa9, uVar7 <= bVar3)))) {
      uVar5 = -uVar6;
      if (!bVar2) {
        uVar5 = uVar6;
      }
      if (pbVar9 != pbVar11) goto LAB_01c871b8;
      goto LAB_01c87060;
    }
    uVar10 = uVar6 * uVar8 + (ulong)bVar3;
    if (uVar10 < uVar6) break;
    pbVar9 = pbVar9 + 1;
    uVar6 = uVar10;
  }
  piVar4 = __errno_location();
  *piVar4 = 0x22;
  uVar5 = 0xffffffffffffffff;
LAB_01c871b8:
  if (endptr != (char **)0x0) {
    if (pbVar9 != pbVar11) {
      nptr = (char *)pbVar9;
    }
    *endptr = nptr;
  }
  return uVar5;
}

Assistant:

uintmax_t
malloc_strtoumax(const char *restrict nptr, char **restrict endptr, int base) {
	uintmax_t ret, digit;
	unsigned b;
	bool neg;
	const char *p, *ns;

	p = nptr;
	if (base < 0 || base == 1 || base > 36) {
		ns = p;
		set_errno(EINVAL);
		ret = UINTMAX_MAX;
		goto label_return;
	}
	b = base;

	/* Swallow leading whitespace and get sign, if any. */
	neg = false;
	while (true) {
		switch (*p) {
		case '\t': case '\n': case '\v': case '\f': case '\r': case ' ':
			p++;
			break;
		case '-':
			neg = true;
			JEMALLOC_FALLTHROUGH;
		case '+':
			p++;
			JEMALLOC_FALLTHROUGH;
		default:
			goto label_prefix;
		}
	}

	/* Get prefix, if any. */
	label_prefix:
	/*
	 * Note where the first non-whitespace/sign character is so that it is
	 * possible to tell whether any digits are consumed (e.g., "  0" vs.
	 * "  -x").
	 */
	ns = p;
	if (*p == '0') {
		switch (p[1]) {
		case '0': case '1': case '2': case '3': case '4': case '5':
		case '6': case '7':
			if (b == 0) {
				b = 8;
			}
			if (b == 8) {
				p++;
			}
			break;
		case 'X': case 'x':
			switch (p[2]) {
			case '0': case '1': case '2': case '3': case '4':
			case '5': case '6': case '7': case '8': case '9':
			case 'A': case 'B': case 'C': case 'D': case 'E':
			case 'F':
			case 'a': case 'b': case 'c': case 'd': case 'e':
			case 'f':
				if (b == 0) {
					b = 16;
				}
				if (b == 16) {
					p += 2;
				}
				break;
			default:
				break;
			}
			break;
		default:
			p++;
			ret = 0;
			goto label_return;
		}
	}
	if (b == 0) {
		b = 10;
	}

	/* Convert. */
	ret = 0;
	while ((*p >= '0' && *p <= '9' && (digit = *p - '0') < b)
	    || (*p >= 'A' && *p <= 'Z' && (digit = 10 + *p - 'A') < b)
	    || (*p >= 'a' && *p <= 'z' && (digit = 10 + *p - 'a') < b)) {
		uintmax_t pret = ret;
		ret *= b;
		ret += digit;
		if (ret < pret) {
			/* Overflow. */
			set_errno(ERANGE);
			ret = UINTMAX_MAX;
			goto label_return;
		}
		p++;
	}
	if (neg) {
		ret = (uintmax_t)(-((intmax_t)ret));
	}

	if (p == ns) {
		/* No conversion performed. */
		set_errno(EINVAL);
		ret = UINTMAX_MAX;
		goto label_return;
	}

label_return:
	if (endptr != NULL) {
		if (p == ns) {
			/* No characters were converted. */
			*endptr = (char *)nptr;
		} else {
			*endptr = (char *)p;
		}
	}
	return ret;
}